

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.cpp
# Opt level: O2

string * __thiscall
OpenMD::SectionParser::stripComments
          (string *__return_storage_ptr__,SectionParser *this,string *line)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  
  sVar5 = line->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar4 = false;
  uVar6 = 0;
  bVar8 = false;
  do {
    if ((uint)sVar5 <= uVar6) {
      return __return_storage_ptr__;
    }
    if (bVar8) {
      cVar1 = (line->_M_dataplus)._M_p[uVar6];
      bVar9 = (bool)(cVar1 == '\n' & bVar4);
      bVar3 = cVar1 != '\n';
      if ((cVar1 == '\n') || ((bool)(bVar4 ^ 1))) goto LAB_001d77b2;
LAB_001d777a:
      pcVar2 = (line->_M_dataplus)._M_p;
      bVar3 = bVar8;
      bVar9 = true;
      if ((pcVar2[uVar6] == '*') && (bVar9 = pcVar2[(ulong)uVar6 + 1] != '/', !bVar9)) {
        uVar6 = uVar6 + 1;
      }
    }
    else {
      if (bVar4) goto LAB_001d777a;
      pcVar2 = (line->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar6];
      if (cVar1 == '/') {
        cVar1 = pcVar2[(ulong)uVar6 + 1];
        uVar7 = uVar6 + 1;
        if (cVar1 == '*') {
          bVar9 = true;
          goto LAB_001d77ea;
        }
        if (cVar1 != '/') goto LAB_001d77d6;
        uVar6 = uVar7;
        bVar3 = true;
        bVar9 = false;
      }
      else if (cVar1 == '#') {
        uVar6 = uVar6 + 1;
        bVar3 = true;
        bVar9 = false;
      }
      else {
LAB_001d77d6:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        bVar9 = false;
        uVar7 = uVar6;
LAB_001d77ea:
        uVar6 = uVar7;
        bVar3 = false;
      }
    }
LAB_001d77b2:
    bVar4 = bVar9;
    bVar8 = bVar3;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

std::string SectionParser::stripComments(const std::string& line) {
    unsigned int n = line.length();
    std::string res;

    // Flags to indicate that single line and multpile line comments
    // have started or not.
    bool s_cmt = false;
    bool m_cmt = false;

    // Traverse the line
    for (unsigned int i = 0; i < n; i++) {
      // If single line comment flag is on, then check for end of it
      if (s_cmt == true && line[i] == '\n') s_cmt = false;

      // If multiple line comment is on, then check for end of it
      else if (m_cmt == true && line[i] == '*' && line[i + 1] == '/')
        m_cmt = false, i++;

      // If this character is in a comment, ignore it
      else if (s_cmt || m_cmt)
        continue;

      // Check for beginning of comments and set the approproate flags
      else if ((line[i] == '/' && line[i + 1] == '/') || (line[i] == '#'))
        s_cmt = true, i++;
      else if (line[i] == '/' && line[i + 1] == '*')
        m_cmt = true, i++;

      // If current character is a non-comment character, append it to res
      else
        res += line[i];
    }
    return res;
  }